

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O0

Tensor<3> * Omega_h::maxdet_metric<3,4>(Few<Omega_h::Matrix<3,_3>,_4> ms)

{
  Tensor<3> *in_RDI;
  Matrix<3,_3> *m;
  double local_3f8;
  Real det;
  undefined1 local_3e8 [4];
  Int i_1;
  double local_3a0;
  Real maxdet;
  undefined1 *local_390;
  int local_384;
  undefined1 *local_380;
  undefined4 local_374;
  undefined1 *local_370;
  double local_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double dStack_338;
  double local_330;
  double dStack_328;
  Real i_2;
  Real h_1;
  Real g_1;
  Real f_1;
  Real e_1;
  Real d_1;
  Real c_1;
  Real b_1;
  Real a_1;
  double *local_2d0;
  undefined4 local_2c4;
  double *local_2c0;
  undefined4 local_2b4;
  double *local_2b0;
  undefined4 local_2a4;
  double *local_2a0;
  undefined4 local_294;
  double *local_290;
  undefined4 local_284;
  double *local_280;
  undefined4 local_274;
  double *local_270;
  undefined4 local_264;
  double *local_260;
  undefined4 local_254;
  double *local_250;
  undefined4 local_244;
  double *local_240;
  undefined4 local_234;
  double *local_230;
  undefined4 local_224;
  double *local_220;
  undefined4 local_214;
  double *local_210;
  undefined4 local_204;
  double *local_200;
  undefined4 local_1f4;
  double *local_1f0;
  undefined4 local_1e4;
  double *local_1e0;
  undefined4 local_1d4;
  double *local_1d0;
  undefined4 local_1c4;
  double *local_1c0;
  double local_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  Real i;
  Real h;
  Real g;
  Real f;
  Real e;
  Real d;
  Real c;
  Real b;
  Real a;
  double *local_120;
  undefined4 local_114;
  double *local_110;
  undefined4 local_104;
  double *local_100;
  undefined4 local_f4;
  double *local_f0;
  undefined4 local_e4;
  double *local_e0;
  undefined4 local_d4;
  double *local_d0;
  undefined4 local_c4;
  double *local_c0;
  undefined4 local_b4;
  double *local_b0;
  undefined4 local_a4;
  double *local_a0;
  undefined4 local_94;
  double *local_90;
  undefined4 local_84;
  double *local_80;
  undefined4 local_74;
  double *local_70;
  undefined4 local_64;
  double *local_60;
  undefined4 local_54;
  double *local_50;
  undefined4 local_44;
  double *local_40;
  undefined4 local_34;
  double *local_30;
  undefined4 local_24;
  double *local_20;
  undefined4 local_14;
  double *local_10;
  
  local_374 = 0;
  local_370 = &stack0x00000008;
  memcpy(in_RDI,&stack0x00000008,0x48);
  memcpy(local_3e8,in_RDI,0x48);
  memcpy(&local_1b8,local_3e8,0x48);
  local_a0 = &local_1b8;
  local_14 = 0;
  local_a4 = 0;
  local_20 = &local_1b8;
  local_24 = 1;
  local_b0 = &dStack_1a0;
  local_b4 = 0;
  local_30 = &local_1b8;
  local_34 = 2;
  local_c0 = &dStack_188;
  local_c4 = 0;
  local_d0 = &local_1b8;
  local_44 = 0;
  local_d4 = 1;
  local_50 = &local_1b8;
  local_54 = 1;
  local_e0 = &dStack_1a0;
  local_e4 = 1;
  local_60 = &local_1b8;
  local_64 = 2;
  local_f0 = &dStack_188;
  local_f4 = 1;
  local_100 = &local_1b8;
  local_74 = 0;
  local_104 = 2;
  local_80 = &local_1b8;
  local_84 = 1;
  local_110 = &dStack_1a0;
  local_114 = 2;
  local_90 = &local_1b8;
  local_94 = 2;
  local_120 = &dStack_188;
  a._4_4_ = 2;
  local_3a0 = -(local_1b8 * local_180) * dStack_190 +
              -(dStack_1a0 * dStack_1b0) * dStack_178 +
              -(dStack_188 * local_198) * dStack_1a8 +
              dStack_188 * dStack_1b0 * dStack_190 +
              local_1b8 * local_198 * dStack_178 + dStack_1a0 * local_180 * dStack_1a8;
  local_70 = local_100;
  local_40 = local_d0;
  local_10 = local_a0;
  for (det._4_4_ = 1; det._4_4_ < 4; det._4_4_ = det._4_4_ + 1) {
    local_384 = det._4_4_;
    local_380 = &stack0x00000008;
    memcpy(&m,&stack0x00000008 + (long)det._4_4_ * 0x48,0x48);
    memcpy(&local_368,&m,0x48);
    local_250 = &local_368;
    local_1c4 = 0;
    local_254 = 0;
    local_1d0 = &local_368;
    local_1d4 = 1;
    local_260 = &dStack_350;
    local_264 = 0;
    local_1e0 = &local_368;
    local_1e4 = 2;
    local_270 = &dStack_338;
    local_274 = 0;
    local_280 = &local_368;
    local_1f4 = 0;
    local_284 = 1;
    local_200 = &local_368;
    local_204 = 1;
    local_290 = &dStack_350;
    local_294 = 1;
    local_210 = &local_368;
    local_214 = 2;
    local_2a0 = &dStack_338;
    local_2a4 = 1;
    local_2b0 = &local_368;
    local_224 = 0;
    local_2b4 = 2;
    local_230 = &local_368;
    local_234 = 1;
    local_2c0 = &dStack_350;
    local_2c4 = 2;
    local_240 = &local_368;
    local_244 = 2;
    local_2d0 = &dStack_338;
    a_1._4_4_ = 2;
    local_3f8 = -(local_368 * local_330) * dStack_340 +
                -(dStack_350 * dStack_360) * dStack_328 +
                -(dStack_338 * local_348) * dStack_358 +
                dStack_338 * dStack_360 * dStack_340 +
                local_368 * local_348 * dStack_328 + dStack_350 * local_330 * dStack_358;
    local_220 = local_2b0;
    local_1f0 = local_280;
    local_1c0 = local_250;
    if (local_3a0 < local_3f8) {
      maxdet._4_4_ = det._4_4_;
      local_390 = &stack0x00000008;
      memcpy(in_RDI,&stack0x00000008 + (long)det._4_4_ * 0x48,0x48);
      local_3a0 = local_3f8;
    }
  }
  return in_RDI;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> maxdet_metric(Few<Tensor<dim>, n> const ms) {
  auto m = ms[0];
  auto maxdet = determinant(m);
  for (Int i = 1; i < n; ++i) {
    auto det = determinant(ms[i]);
    if (det > maxdet) {
      m = ms[i];
      maxdet = det;
    }
  }
  return m;
}